

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O2

TPZString * __thiscall
TPZString::SubStr(TPZString *__return_storage_ptr__,TPZString *this,int start,int end)

{
  size_t sVar1;
  TPZString *newstring;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  sVar1 = Length(this);
  if (end < start || sVar1 < (ulong)(long)start) {
    TPZString(__return_storage_ptr__);
  }
  else {
    uVar2 = 0;
    uVar4 = (ulong)(uint)start;
    if (start < 1) {
      uVar4 = uVar2;
    }
    iVar3 = (int)sVar1 + -1;
    if ((ulong)(long)end <= sVar1) {
      iVar3 = end;
    }
    TPZString(__return_storage_ptr__,(iVar3 - (int)uVar4) + 2);
    for (; (long)uVar4 <= (long)iVar3; uVar4 = uVar4 + 1) {
      (__return_storage_ptr__->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.
      super_TPZVec<char>.fStore[uVar2] =
           (this->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore
           [uVar4];
      uVar2 = uVar2 + 1;
    }
    (__return_storage_ptr__->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.
    super_TPZVec<char>.fStore
    [(__return_storage_ptr__->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.
     super_TPZVec<char>.fNElements + -1] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

TPZString TPZString::SubStr(const int start, const int end) const
{
	size_t len = Length();
	if (start > len || start > end)
	{
		TPZString newstring;
		return newstring;
	}
	
	int startpos = start, endpos = end, i;
	
	if (startpos < 0) startpos = 0;
	
	if (endpos > len) endpos = len - 1; // null ending character index
	
	TPZString newstring(endpos - startpos + 2);
	for (i = startpos; i <= endpos; i++) newstring[i - startpos] = fStore[i];
	
	newstring[newstring.NElements() - 1] = '\0';
	return newstring;
}